

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O1

int xe::getEnumValue(char *enumName,EnumMapEntry *entries,int numEntries,char *name)

{
  deUint32 dVar1;
  deUint32 dVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  dVar1 = deStringHash(name);
  bVar7 = 0 < numEntries;
  dVar2 = dVar1;
  if (0 < numEntries) {
    piVar5 = &entries->value;
    uVar6 = 1;
    do {
      if ((((EnumMapEntry *)(piVar5 + -4))->hash == dVar1) &&
         (dVar2 = deStringEqual(*(char **)(piVar5 + -2),name), dVar2 != 0)) {
        dVar2 = *piVar5;
        break;
      }
      bVar7 = uVar6 < (uint)numEntries;
      piVar5 = piVar5 + 6;
      bVar8 = uVar6 != (uint)numEntries;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  if (!bVar7) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Could not map \'","");
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    local_90 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_90 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_70 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_b0 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_b0 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(this,(string *)&local_b0);
    *(undefined ***)this = &PTR__runtime_error_0011b810;
    __cxa_throw(this,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  return dVar2;
}

Assistant:

static inline int getEnumValue (const char* enumName, const EnumMapEntry* entries, int numEntries, const char* name)
{
	deUint32 hash = deStringHash(name);

	for (int ndx = 0; ndx < numEntries; ndx++)
	{
		if (entries[ndx].hash == hash && deStringEqual(entries[ndx].name, name))
			return entries[ndx].value;
	}

	throw TestResultParseError(string("Could not map '") + name + "' to " + enumName);
}